

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo
          (cmComputeLinkInformation *this,string *fullPath,cmTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  char *local_a8;
  char *soname;
  string soName;
  allocator local_41;
  string local_40;
  cmTarget *local_20;
  cmTarget *target_local;
  string *fullPath_local;
  cmComputeLinkInformation *this_local;
  
  this_00 = this->Makefile;
  local_20 = target;
  target_local = (cmTarget *)fullPath;
  fullPath_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_41);
  bVar1 = cmMakefile::IsOn(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((!bVar1) || (bVar1 = cmTarget::HasMacOSXRpathInstallNameDir(local_20,&this->Config), bVar1)) {
    TVar2 = cmTarget::GetType(local_20);
    if (TVar2 == UNKNOWN_LIBRARY) {
      AddLibraryRuntimeInfo(this,(string *)target_local);
    }
    else {
      TVar2 = cmTarget::GetType(local_20);
      if (TVar2 == SHARED_LIBRARY) {
        cmTarget::GetSOName((string *)&soname,local_20,&this->Config);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          local_a8 = (char *)std::__cxx11::string::c_str();
        }
        else {
          local_a8 = (char *)0x0;
        }
        cmOrderDirectories::AddRuntimeLibrary
                  (this->OrderRuntimeSearchPath,(string *)target_local,local_a8);
        if ((this->LinkWithRuntimePath & 1U) != 0) {
          cmOrderDirectories::AddRuntimeLibrary
                    (this->OrderLinkerSearchPath,(string *)target_local,local_a8);
        }
        std::__cxx11::string::~string((string *)&soname);
      }
    }
  }
  return;
}

Assistant:

void
cmComputeLinkInformation::AddLibraryRuntimeInfo(std::string const& fullPath,
                                                cmTarget const* target)
{
  // Ignore targets on Apple where install_name is not @rpath.
  // The dependenty library can be found with other means such as
  // @loader_path or full paths.
  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME"))
    {
    if(!target->HasMacOSXRpathInstallNameDir(this->Config))
      {
      return;
      }
    }

  // Libraries with unknown type must be handled using just the file
  // on disk.
  if(target->GetType() == cmTarget::UNKNOWN_LIBRARY)
    {
    this->AddLibraryRuntimeInfo(fullPath);
    return;
    }

  // Skip targets that are not shared libraries (modules cannot be linked).
  if(target->GetType() != cmTarget::SHARED_LIBRARY)
    {
    return;
    }

  // Try to get the soname of the library.  Only files with this name
  // could possibly conflict.
  std::string soName = target->GetSOName(this->Config);
  const char* soname = soName.empty()? 0 : soName.c_str();

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath, soname);
  if(this->LinkWithRuntimePath)
    {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath, soname);
    }
}